

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar3;
  int hcut;
  int wcut;
  Option opt_b_1;
  Mat top_blob_bordered_adj_1;
  Option opt_b;
  Mat top_blob_bordered_adj;
  int i_10;
  int size_7;
  float *outptr_9;
  int i_9;
  float max_1;
  float min_1;
  int size_6;
  float *outptr_8;
  int i_8;
  float slope_1;
  int size_5;
  float *outptr_7;
  int i_7;
  int size_4;
  float *outptr_6;
  int k_1;
  float val_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float *outptr_5;
  int j_2;
  int i_6;
  float bias_1;
  float *weight_data_ptr;
  Mat out;
  int p;
  int g_1;
  int num_output_g;
  int channels_g;
  int i_5;
  int size_3;
  float *outptr_4;
  int i_4;
  float max;
  float min;
  int size_2;
  float *outptr_3;
  int i_3;
  float slope;
  int size_1;
  float *outptr_2;
  int i_2;
  int size;
  float *outptr_1;
  float w_1;
  float val;
  int k;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat m;
  float *kptr;
  int in_stack_000003f8;
  int in_stack_000003fc;
  int in_stack_00000400;
  float in_stack_00000404;
  int in_stack_00000408;
  int in_stack_0000040c;
  int in_stack_00000410;
  int in_stack_00000414;
  Mat *in_stack_00000418;
  Mat *in_stack_00000420;
  int in_stack_00000430;
  float *inptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  float in_stack_fffffffffffffaec;
  undefined1 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf1;
  undefined1 in_stack_fffffffffffffaf2;
  undefined1 in_stack_fffffffffffffaf3;
  float in_stack_fffffffffffffaf4;
  size_type in_stack_fffffffffffffaf8;
  Mat *in_stack_fffffffffffffb00;
  float local_4e4;
  float local_4ac;
  float local_46c;
  float local_43c;
  undefined1 local_3f8 [112];
  undefined1 local_388 [112];
  int local_318;
  int local_314;
  float *local_310;
  int local_308;
  float local_304;
  float local_300;
  int local_2fc;
  float *local_2f8;
  int local_2ec;
  float local_2e8;
  int local_2e4;
  float *local_2e0;
  float local_2d4;
  int local_2d0;
  int local_2cc;
  float *local_2c8;
  int local_2c0;
  float local_2bc;
  Mat local_2b8;
  int local_274;
  float *local_270;
  float *local_268;
  int local_25c;
  int local_258;
  float local_254;
  float *local_250;
  Mat local_248;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  float *local_1f0;
  int local_1e8;
  float local_1e4;
  float local_1e0;
  int local_1dc;
  float *local_1d8;
  int local_1cc;
  float local_1c8;
  int local_1c4;
  float *local_1c0;
  float local_1b4;
  int local_1b0;
  int local_1ac;
  float *local_1a8;
  float local_19c;
  float local_198;
  int local_194;
  float *local_190;
  int local_184;
  int local_180;
  float local_17c;
  Mat local_178;
  float *local_138;
  Mat local_130;
  float *local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  reference local_d0;
  vector<int,_std::allocator<int>_> local_c0;
  int local_a4;
  int local_a0;
  Mat local_90;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_28;
  long local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  if ((local_34 % *(int *)(in_RDI + 0xfc) != 0) ||
     (*(int *)(in_RDI + 0xb8) % *(int *)(in_RDI + 0xfc) != 0)) {
    return -100;
  }
  local_44 = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
  local_48 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
  local_4c = (local_2c + -1) * *(int *)(in_RDI + 0xcc) + local_44;
  local_50 = (local_30 + -1) * *(int *)(in_RDI + 0xd0) + local_48;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_90);
  if ((((*(int *)(in_RDI + 0xd4) < 1) && (*(int *)(in_RDI + 0xd8) < 1)) &&
      (*(int *)(in_RDI + 0xdc) < 1)) &&
     (((*(int *)(in_RDI + 0xe0) < 1 && (*(int *)(in_RDI + 0xe4) < 1)) &&
      ((*(int *)(in_RDI + 0xe8) < 1 &&
       ((*(int *)(in_RDI + 0xec) < 1 || (*(int *)(in_RDI + 0xf0) < 1)))))))) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   in_stack_fffffffffffffae0);
    Mat::create(in_stack_fffffffffffffb00,(int)(in_stack_fffffffffffffaf8 >> 0x20),
                (int)in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4,
                CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                (Allocator *)in_stack_fffffffffffffae0);
  }
  else {
    Mat::create(in_stack_fffffffffffffb00,(int)(in_stack_fffffffffffffaf8 >> 0x20),
                (int)in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4,
                CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                (Allocator *)in_stack_fffffffffffffae0);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffae0);
  if (bVar1) {
    local_4 = -100;
    local_a0 = 1;
    goto LAB_001af688;
  }
  local_a4 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
  std::allocator<int>::allocator((allocator<int> *)0x1adda4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00,
             in_stack_fffffffffffffaf8,
             (allocator_type *)
             CONCAT44(in_stack_fffffffffffffaf4,
                      CONCAT13(in_stack_fffffffffffffaf3,
                               CONCAT12(in_stack_fffffffffffffaf2,
                                        CONCAT11(in_stack_fffffffffffffaf1,in_stack_fffffffffffffaf0
                                                )))));
  std::allocator<int>::~allocator((allocator<int> *)0x1addd0);
  local_d0 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,0);
  local_d4 = 0;
  local_d8 = 0;
  local_dc = local_4c * *(int *)(in_RDI + 200) - *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc4);
  for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0xc0); local_e0 = local_e0 + 1) {
    for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0xbc); local_e4 = local_e4 + 1) {
      local_d0[local_d4] = local_d8;
      local_d4 = local_d4 + 1;
      local_d8 = *(int *)(in_RDI + 0xc4) + local_d8;
    }
    local_d8 = local_dc + local_d8;
  }
  if ((local_34 == *(int *)(in_RDI + 0xfc)) && (*(int *)(in_RDI + 0xfc) == *(int *)(in_RDI + 0xb8)))
  {
    for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0xfc); local_e8 = local_e8 + 1) {
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_130);
      Mat::~Mat((Mat *)0x1adfbf);
      local_f0 = pfVar2;
      local_138 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x148));
      local_138 = local_138 + local_a4 * local_e8;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
      if (*(int *)(in_RDI + 0xf4) == 0) {
        local_43c = 0.0;
      }
      else {
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x188),(long)local_e8);
        local_43c = *pfVar2;
      }
      local_17c = local_43c;
      Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffaf4,
                                CONCAT13(in_stack_fffffffffffffaf3,
                                         CONCAT12(in_stack_fffffffffffffaf2,
                                                  CONCAT11(in_stack_fffffffffffffaf1,
                                                           in_stack_fffffffffffffaf0)))),
                in_stack_fffffffffffffaec);
      for (local_180 = 0; local_180 < local_30; local_180 = local_180 + 1) {
        for (local_184 = 0; local_184 < local_2c; local_184 = local_184 + 1) {
          local_190 = Mat::row(&local_178,local_180 * *(int *)(in_RDI + 0xd0));
          local_190 = local_190 + local_184 * *(int *)(in_RDI + 0xcc);
          for (local_194 = 0; local_194 < local_a4; local_194 = local_194 + 1) {
            local_198 = local_f0[local_180 * local_2c + local_184];
            local_19c = local_138[local_194];
            local_190[local_d0[local_194]] = local_198 * local_19c + local_190[local_d0[local_194]];
          }
        }
      }
      if (*(int *)(in_RDI + 0x100) == 1) {
        local_1a8 = Mat::operator_cast_to_float_(&local_178);
        local_1ac = local_4c * local_50;
        for (local_1b0 = 0; local_1b0 < local_1ac; local_1b0 = local_1b0 + 1) {
          local_1b4 = 0.0;
          pfVar2 = std::max<float>(local_1a8 + local_1b0,&local_1b4);
          local_1a8[local_1b0] = *pfVar2;
        }
      }
      else if (*(int *)(in_RDI + 0x100) == 2) {
        local_1c0 = Mat::operator_cast_to_float_(&local_178);
        local_1c4 = local_4c * local_50;
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x108),0);
        local_1c8 = *pfVar2;
        for (local_1cc = 0; local_1cc < local_1c4; local_1cc = local_1cc + 1) {
          if (local_1c0[local_1cc] <= 0.0) {
            local_46c = local_1c0[local_1cc] * local_1c8;
          }
          else {
            local_46c = local_1c0[local_1cc];
          }
          local_1c0[local_1cc] = local_46c;
        }
      }
      else if (*(int *)(in_RDI + 0x100) == 3) {
        local_1d8 = Mat::operator_cast_to_float_(&local_178);
        local_1dc = local_4c * local_50;
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x108),0);
        local_1e0 = *pfVar2;
        pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x108),1);
        local_1e4 = *pfVar2;
        for (local_1e8 = 0; local_1e8 < local_1dc; local_1e8 = local_1e8 + 1) {
          if (local_1d8[local_1e8] < local_1e0) {
            local_1d8[local_1e8] = local_1e0;
          }
          if (local_1e4 < local_1d8[local_1e8]) {
            local_1d8[local_1e8] = local_1e4;
          }
        }
      }
      else if (*(int *)(in_RDI + 0x100) == 4) {
        local_1f0 = Mat::operator_cast_to_float_(&local_178);
        local_1f4 = local_4c * local_50;
        for (local_1f8 = 0; local_1f8 < local_1f4; local_1f8 = local_1f8 + 1) {
          dVar3 = std::exp((double)((ulong)(uint)local_1f0[local_1f8] ^ 0x8000000080000000));
          local_1f0[local_1f8] = 1.0 / (SUB84(dVar3,0) + 1.0);
        }
      }
      Mat::~Mat((Mat *)0x1ae743);
    }
  }
  else {
    local_1fc = local_34 / *(int *)(in_RDI + 0xfc);
    local_200 = *(int *)(in_RDI + 0xb8) / *(int *)(in_RDI + 0xfc);
    for (local_204 = 0; local_204 < *(int *)(in_RDI + 0xfc); local_204 = local_204 + 1) {
      for (local_208 = 0; local_208 < local_200; local_208 = local_208 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                     (int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
        local_250 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x148));
        local_250 = local_250 + local_a4 * local_1fc * local_200 * local_204;
        if (*(int *)(in_RDI + 0xf4) == 0) {
          local_4ac = 0.0;
        }
        else {
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x188),(long)(local_204 * local_200 + local_208)
                                  );
          local_4ac = *pfVar2;
        }
        local_254 = local_4ac;
        Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffaf4,
                                  CONCAT13(in_stack_fffffffffffffaf3,
                                           CONCAT12(in_stack_fffffffffffffaf2,
                                                    CONCAT11(in_stack_fffffffffffffaf1,
                                                             in_stack_fffffffffffffaf0)))),
                  in_stack_fffffffffffffaec);
        for (local_258 = 0; local_258 < local_30; local_258 = local_258 + 1) {
          for (local_25c = 0; local_25c < local_2c; local_25c = local_25c + 1) {
            local_268 = Mat::row(&local_248,local_258 * *(int *)(in_RDI + 0xd0));
            local_268 = local_268 + local_25c * *(int *)(in_RDI + 0xcc);
            local_270 = local_250 + local_a4 * local_1fc * local_208;
            for (local_274 = 0; local_274 < local_1fc; local_274 = local_274 + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                           (int)((ulong)in_stack_fffffffffffffae0 >> 0x20));
              pfVar2 = Mat::row(&local_2b8,local_258);
              local_2bc = pfVar2[local_25c];
              for (local_2c0 = 0; local_2c0 < local_a4; local_2c0 = local_2c0 + 1) {
                local_268[local_d0[local_2c0]] =
                     local_2bc * local_270[local_2c0] + local_268[local_d0[local_2c0]];
              }
              local_270 = local_270 + local_a4;
              Mat::~Mat((Mat *)0x1aeb1f);
            }
          }
        }
        if (*(int *)(in_RDI + 0x100) == 1) {
          local_2c8 = Mat::operator_cast_to_float_(&local_248);
          local_2cc = local_4c * local_50;
          for (local_2d0 = 0; local_2d0 < local_2cc; local_2d0 = local_2d0 + 1) {
            local_2d4 = 0.0;
            pfVar2 = std::max<float>(local_2c8 + local_2d0,&local_2d4);
            local_2c8[local_2d0] = *pfVar2;
          }
        }
        else if (*(int *)(in_RDI + 0x100) == 2) {
          local_2e0 = Mat::operator_cast_to_float_(&local_248);
          local_2e4 = local_4c * local_50;
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x108),0);
          local_2e8 = *pfVar2;
          for (local_2ec = 0; local_2ec < local_2e4; local_2ec = local_2ec + 1) {
            if (local_2e0[local_2ec] <= 0.0) {
              local_4e4 = local_2e0[local_2ec] * local_2e8;
            }
            else {
              local_4e4 = local_2e0[local_2ec];
            }
            local_2e0[local_2ec] = local_4e4;
          }
        }
        else if (*(int *)(in_RDI + 0x100) == 3) {
          local_2f8 = Mat::operator_cast_to_float_(&local_248);
          local_2fc = local_4c * local_50;
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x108),0);
          local_300 = *pfVar2;
          pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x108),1);
          local_304 = *pfVar2;
          for (local_308 = 0; local_308 < local_2fc; local_308 = local_308 + 1) {
            if (local_2f8[local_308] < local_300) {
              local_2f8[local_308] = local_300;
            }
            if (local_304 < local_2f8[local_308]) {
              local_2f8[local_308] = local_304;
            }
          }
        }
        else if (*(int *)(in_RDI + 0x100) == 4) {
          local_310 = Mat::operator_cast_to_float_(&local_248);
          local_314 = local_4c * local_50;
          for (local_318 = 0; local_318 < local_314; local_318 = local_318 + 1) {
            dVar3 = std::exp((double)((ulong)(uint)local_310[local_318] ^ 0x8000000080000000));
            in_stack_fffffffffffffaf4 = SUB84(dVar3,0);
            local_310[local_318] = 1.0 / (in_stack_fffffffffffffaf4 + 1.0);
          }
        }
        Mat::~Mat((Mat *)0x1aefc4);
      }
    }
  }
  if ((((*(int *)(in_RDI + 0xd4) < 1) && (*(int *)(in_RDI + 0xd8) < 1)) &&
      (*(int *)(in_RDI + 0xdc) < 1)) && (*(int *)(in_RDI + 0xe0) < 1)) {
    if ((*(int *)(in_RDI + 0xec) < 1) || (*(int *)(in_RDI + 0xf0) < 1)) {
      if ((*(int *)(in_RDI + 0xe4) < 1) && (*(int *)(in_RDI + 0xe8) < 1)) {
        Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                       in_stack_fffffffffffffae0);
      }
      else {
        copy_make_border(in_stack_00000420,in_stack_00000418,in_stack_00000414,in_stack_00000410,
                         in_stack_0000040c,in_stack_00000408,in_stack_00000430,in_stack_00000404,
                         (Option *)inptr);
        bVar1 = Mat::empty(local_28);
        if (bVar1) {
          local_4 = -100;
          local_a0 = 1;
          goto LAB_001af66a;
        }
      }
    }
    else {
      Mat::Mat((Mat *)(local_3f8 + 0x30),&local_90);
      if ((*(int *)(in_RDI + 0xe4) < 1) && (*(int *)(in_RDI + 0xe8) < 1)) {
LAB_001af392:
        if ((((*(int *)(in_RDI + 0xd4) == -0xe9) || (*(int *)(in_RDI + 0xd8) == -0xe9)) ||
            (*(int *)(in_RDI + 0xdc) == -0xe9)) || (*(int *)(in_RDI + 0xe0) == -0xe9)) {
          copy_cut_border((Mat *)CONCAT44(in_stack_00000414,in_stack_00000410),
                          (Mat *)CONCAT44(in_stack_0000040c,in_stack_00000408),
                          (int)in_stack_00000404,in_stack_00000400,in_stack_000003fc,
                          in_stack_000003f8,(Option *)in_stack_00000420);
        }
        else if (((*(int *)(in_RDI + 0xd4) == -0xea) || (*(int *)(in_RDI + 0xd8) == -0xea)) ||
                ((*(int *)(in_RDI + 0xdc) == -0xea || (*(int *)(in_RDI + 0xe0) == -0xea)))) {
          copy_cut_border((Mat *)CONCAT44(in_stack_00000414,in_stack_00000410),
                          (Mat *)CONCAT44(in_stack_0000040c,in_stack_00000408),
                          (int)in_stack_00000404,in_stack_00000400,in_stack_000003fc,
                          in_stack_000003f8,(Option *)in_stack_00000420);
        }
        in_stack_fffffffffffffaf0 = Mat::empty(in_stack_fffffffffffffae0);
        if ((bool)in_stack_fffffffffffffaf0) {
          local_4 = -100;
          local_a0 = 1;
        }
        else {
          local_4c = *(int *)(local_20 + 0x2c);
          local_50 = *(int *)(local_20 + 0x30);
          local_a0 = 0;
        }
      }
      else {
        local_3f8._32_8_ = local_28->allocator;
        local_3f8._0_8_ = local_28->data;
        local_3f8._16_8_ = local_28->elemsize;
        local_3f8._24_4_ = local_28->elempack;
        local_3f8._28_4_ = *(undefined4 *)&local_28->field_0x1c;
        local_3f8._8_8_ = local_28->elemsize;
        in_stack_fffffffffffffae0 = (Mat *)local_3f8;
        copy_make_border(in_stack_00000420,in_stack_00000418,in_stack_00000414,in_stack_00000410,
                         in_stack_0000040c,in_stack_00000408,in_stack_00000430,in_stack_00000404,
                         (Option *)inptr);
        in_stack_fffffffffffffaf1 = Mat::empty(in_stack_fffffffffffffae0);
        if (!(bool)in_stack_fffffffffffffaf1) goto LAB_001af392;
        local_4 = -100;
        local_a0 = 1;
      }
      Mat::~Mat((Mat *)0x1af57a);
      if (local_a0 != 0) goto LAB_001af66a;
    }
LAB_001af654:
    local_4 = 0;
    local_a0 = 1;
  }
  else {
    Mat::Mat((Mat *)(local_388 + 0x30),&local_90);
    if ((*(int *)(in_RDI + 0xe4) < 1) && (*(int *)(in_RDI + 0xe8) < 1)) {
LAB_001af174:
      copy_cut_border((Mat *)CONCAT44(in_stack_00000414,in_stack_00000410),
                      (Mat *)CONCAT44(in_stack_0000040c,in_stack_00000408),(int)in_stack_00000404,
                      in_stack_00000400,in_stack_000003fc,in_stack_000003f8,
                      (Option *)in_stack_00000420);
      in_stack_fffffffffffffaf2 = Mat::empty(in_stack_fffffffffffffae0);
      if ((bool)in_stack_fffffffffffffaf2) {
        local_4 = -100;
        local_a0 = 1;
      }
      else {
        local_4c = *(int *)(local_20 + 0x2c);
        local_50 = *(int *)(local_20 + 0x30);
        local_a0 = 0;
      }
    }
    else {
      local_388._32_8_ = local_28->allocator;
      local_388._0_8_ = local_28->data;
      local_388._16_8_ = local_28->elemsize;
      local_388._24_4_ = local_28->elempack;
      local_388._28_4_ = *(undefined4 *)&local_28->field_0x1c;
      local_388._8_8_ = local_28->elemsize;
      in_stack_fffffffffffffae0 = (Mat *)local_388;
      copy_make_border(in_stack_00000420,in_stack_00000418,in_stack_00000414,in_stack_00000410,
                       in_stack_0000040c,in_stack_00000408,in_stack_00000430,in_stack_00000404,
                       (Option *)inptr);
      in_stack_fffffffffffffaf3 = Mat::empty(in_stack_fffffffffffffae0);
      if (!(bool)in_stack_fffffffffffffaf3) goto LAB_001af174;
      local_4 = -100;
      local_a0 = 1;
    }
    Mat::~Mat((Mat *)0x1af22c);
    if (local_a0 == 0) goto LAB_001af654;
  }
LAB_001af66a:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,
                      CONCAT13(in_stack_fffffffffffffaf3,
                               CONCAT12(in_stack_fffffffffffffaf2,
                                        CONCAT11(in_stack_fffffffffffffaf1,in_stack_fffffffffffffaf0
                                                )))));
LAB_001af688:
  Mat::~Mat((Mat *)0x1af695);
  return local_4;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}